

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

string * cfd::core::ToBase58String
                   (string *__return_storage_ptr__,ByteData *serialize_data,string *caller_name)

{
  char *args;
  int iVar1;
  size_t sVar2;
  CfdException *pCVar3;
  uchar *bytes;
  char *wally_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  CfdSourceLocation local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98 [28];
  int local_7c;
  undefined1 local_75;
  int ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  CfdSourceLocation local_40;
  WallyUtil *local_28;
  char *output;
  string *caller_name_local;
  ByteData *serialize_data_local;
  
  local_28 = (WallyUtil *)0x0;
  output = (char *)caller_name;
  caller_name_local = (string *)serialize_data;
  serialize_data_local = (ByteData *)__return_storage_ptr__;
  sVar2 = ByteData::GetDataSize(serialize_data);
  if (sVar2 != 0x4e) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    args = output;
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x8b;
    local_40.funcname = "ToBase58String";
    local_48 = ByteData::GetDataSize((ByteData *)caller_name_local);
    logger::warn<std::__cxx11::string_const&,unsigned_long>
              (&local_40,"{} serialize_data size illegal. size={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,&local_48);
    local_75 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+(&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)output,
                     " serialize_data size error.");
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_68);
    local_75 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                     (ByteData *)caller_name_local);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
  iVar1 = wally_base58_from_bytes(bytes,0x4e,1,(char **)&local_28);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_98);
  local_7c = iVar1;
  if (iVar1 != 0) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0x96;
    local_b0.funcname = "ToBase58String";
    logger::warn<std::__cxx11::string_const&,int&>
              (&local_b0,"{}, wally_base58_from_bytes error. ret={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)output,&local_7c
              );
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)output,
                     " base58 encode error.");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_d0);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,local_28,wally_string);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToBase58String(
    const ByteData& serialize_data, const std::string& caller_name) {
  char* output = nullptr;
  if (serialize_data.GetDataSize() != BIP32_SERIALIZED_LEN) {
    warn(
        CFD_LOG_SOURCE, "{} serialize_data size illegal. size={}", caller_name,
        serialize_data.GetDataSize());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        caller_name + " serialize_data size error.");
  }
  int ret = wally_base58_from_bytes(
      serialize_data.GetBytes().data(), BIP32_SERIALIZED_LEN,
      BASE58_FLAG_CHECKSUM, &output);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "{}, wally_base58_from_bytes error. ret={}",
        caller_name, ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " base58 encode error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}